

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.tab.cc
# Opt level: O0

void __thiscall
tchecker::parsing::system::parser_t::stack_symbol_type::stack_symbol_type
          (stack_symbol_type *this,stack_symbol_type *that)

{
  symbol_kind_type sVar1;
  stack_symbol_type *that_local;
  stack_symbol_type *this_local;
  
  basic_symbol<tchecker::parsing::system::parser_t::by_state>::basic_symbol
            (&this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>,
             (that->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
             super_by_state.state,
             &(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).location);
  sVar1 = by_state::kind((by_state *)that);
  switch(sVar1) {
  case S_TOK_ID:
  case S_TOK_INTEGER:
  case S_TOK_TEXT:
  case S_text_or_empty:
    value_type::move<std::__cxx11::string>
              (&(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value,
               &(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value);
    break;
  default:
    break;
  case S_attr_list:
  case S_non_empty_attr_list:
    value_type::move<tchecker::parsing::attributes_t>
              (&(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value,
               &(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value);
    break;
  case S_attr:
    value_type::move<std::shared_ptr<tchecker::parsing::attr_t>>
              (&(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value,
               &(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value);
    break;
  case S_sync_constraint_list:
    value_type::
    move<std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>>>>
              (&(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value,
               &(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value);
    break;
  case S_sync_constraint:
    value_type::move<std::shared_ptr<tchecker::parsing::sync_constraint_t>>
              (&(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value,
               &(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value);
    break;
  case S_sync_strength:
    value_type::move<tchecker::sync_strength_t>
              (&(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value,
               &(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value);
    break;
  case S_integer:
    value_type::move<int>
              (&(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value,
               &(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value);
    break;
  case S_uinteger:
    value_type::move<unsigned_int>
              (&(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value,
               &(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value);
  }
  (that->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).super_by_state.state =
       '\0';
  return;
}

Assistant:

parser_t::stack_symbol_type::stack_symbol_type (YY_RVREF (stack_symbol_type) that)
    : super_type (YY_MOVE (that.state), YY_MOVE (that.location))
  {
    switch (that.kind ())
    {
      case symbol_kind::S_sync_strength: // sync_strength
        value.YY_MOVE_OR_COPY< enum tchecker::sync_strength_t > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_attr: // attr
        value.YY_MOVE_OR_COPY< std::shared_ptr<tchecker::parsing::attr_t> > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_sync_constraint: // sync_constraint
        value.YY_MOVE_OR_COPY< std::shared_ptr<tchecker::parsing::sync_constraint_t> > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_TOK_ID: // "identifier"
      case symbol_kind::S_TOK_INTEGER: // "integer value"
      case symbol_kind::S_TOK_TEXT: // "text value"
      case symbol_kind::S_text_or_empty: // text_or_empty
        value.YY_MOVE_OR_COPY< std::string > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_sync_constraint_list: // sync_constraint_list
        value.YY_MOVE_OR_COPY< std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>> > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_integer: // integer
        value.YY_MOVE_OR_COPY< tchecker::integer_t > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_attr_list: // attr_list
      case symbol_kind::S_non_empty_attr_list: // non_empty_attr_list
        value.YY_MOVE_OR_COPY< tchecker::parsing::attributes_t > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_uinteger: // uinteger
        value.YY_MOVE_OR_COPY< unsigned int > (YY_MOVE (that.value));
        break;

      default:
        break;
    }

#if 201103L <= YY_CPLUSPLUS
    // that is emptied.
    that.state = empty_state;
#endif
  }